

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

int32_t * icu_63::TZEnumeration::getMap(USystemTimeZoneType type,int32_t *len,UErrorCode *ec)

{
  int32_t *piVar1;
  int32_t iVar2;
  
  *len = 0;
  if (U_ZERO_ERROR < *ec) {
    return (int32_t *)0x0;
  }
  if (type == UCAL_ZONE_TYPE_CANONICAL_LOCATION) {
    umtx_initOnce<USystemTimeZoneType>
              (&gCanonicalLocationZonesInitOnce,initMap,UCAL_ZONE_TYPE_CANONICAL_LOCATION,ec);
    piVar1 = MAP_CANONICAL_SYSTEM_LOCATION_ZONES;
    iVar2 = LEN_CANONICAL_SYSTEM_LOCATION_ZONES;
  }
  else if (type == UCAL_ZONE_TYPE_CANONICAL) {
    umtx_initOnce<USystemTimeZoneType>(&gCanonicalZonesInitOnce,initMap,UCAL_ZONE_TYPE_CANONICAL,ec)
    ;
    piVar1 = MAP_CANONICAL_SYSTEM_ZONES;
    iVar2 = LEN_CANONICAL_SYSTEM_ZONES;
  }
  else if (type == UCAL_ZONE_TYPE_ANY) {
    umtx_initOnce<USystemTimeZoneType>(&gSystemZonesInitOnce,initMap,UCAL_ZONE_TYPE_ANY,ec);
    piVar1 = MAP_SYSTEM_ZONES;
    iVar2 = LEN_SYSTEM_ZONES;
  }
  else {
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    iVar2 = 0;
    piVar1 = (int32_t *)0x0;
  }
  *len = iVar2;
  return piVar1;
}

Assistant:

static int32_t* getMap(USystemTimeZoneType type, int32_t& len, UErrorCode& ec) {
        len = 0;
        if (U_FAILURE(ec)) {
            return NULL;
        }
        int32_t* m = NULL;
        switch (type) {
        case UCAL_ZONE_TYPE_ANY:
            umtx_initOnce(gSystemZonesInitOnce, &initMap, type, ec);
            m = MAP_SYSTEM_ZONES;
            len = LEN_SYSTEM_ZONES;
            break;
        case UCAL_ZONE_TYPE_CANONICAL:
            umtx_initOnce(gCanonicalZonesInitOnce, &initMap, type, ec);
            m = MAP_CANONICAL_SYSTEM_ZONES;
            len = LEN_CANONICAL_SYSTEM_ZONES;
            break;
        case UCAL_ZONE_TYPE_CANONICAL_LOCATION:
            umtx_initOnce(gCanonicalLocationZonesInitOnce, &initMap, type, ec);
            m = MAP_CANONICAL_SYSTEM_LOCATION_ZONES;
            len = LEN_CANONICAL_SYSTEM_LOCATION_ZONES;
            break;
        default:
            ec = U_ILLEGAL_ARGUMENT_ERROR;
            m = NULL;
            len = 0;
            break;
        }
        return m;
    }